

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

int __thiscall Fl_Help_View::get_align(Fl_Help_View *this,char *p,int a)

{
  int iVar1;
  char *pcVar2;
  char local_128 [8];
  char buf [255];
  int a_local;
  char *p_local;
  Fl_Help_View *this_local;
  
  unique0x10000093 = a;
  pcVar2 = get_attr(this,p,"ALIGN",local_128,0xff);
  if (pcVar2 == (char *)0x0) {
    this_local._4_4_ = stack0xffffffffffffffdc;
  }
  else {
    iVar1 = strcasecmp(local_128,"CENTER");
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar1 = strcasecmp(local_128,"RIGHT");
      if (iVar1 == 0) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int					// O - Alignment
Fl_Help_View::get_align(const char *p,	// I - Pointer to start of attrs
                        int        a)	// I - Default alignment
{
  char	buf[255];			// Alignment value


  if (get_attr(p, "ALIGN", buf, sizeof(buf)) == NULL)
    return (a);

  if (strcasecmp(buf, "CENTER") == 0)
    return (CENTER);
  else if (strcasecmp(buf, "RIGHT") == 0)
    return (RIGHT);
  else
    return (LEFT);
}